

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void __thiscall phosg::JSON::JSON(JSON *this,char *s,size_t size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  *(undefined8 *)
   &(this->value).
    super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    .
    super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
       = 0;
  *(__index_type *)
   ((long)&(this->value).
           super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
           .
           super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           .
           super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
   + 0x38) = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,s,s + size);
  ::std::
  variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
  ::operator=((variant<decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
               *)this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

JSON::JSON(const char* s, size_t size) {
  this->value = string(s, size);
}